

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsUtils.cpp
# Opt level: O3

bool initialiseValueDistribution
               (string *distribution_name,string *value_name,double min_value_limit,
               double max_value_limit,double base_value_limit,
               HighsValueDistribution *value_distribution)

{
  pointer pdVar1;
  bool bVar2;
  ulong uVar3;
  uint uVar4;
  double dVar5;
  double dVar6;
  value_type_conflict2 local_24;
  value_type_conflict1 local_20;
  
  std::__cxx11::string::_M_assign((string *)value_distribution);
  std::__cxx11::string::_M_assign((string *)&value_distribution->value_name_);
  bVar2 = false;
  if (0.0 < min_value_limit) {
    bVar2 = false;
    if (min_value_limit <= max_value_limit) {
      uVar4 = 1;
      if ((min_value_limit != max_value_limit) || (NAN(min_value_limit) || NAN(max_value_limit))) {
        if (base_value_limit <= 0.0) {
          return false;
        }
        dVar5 = log(max_value_limit / min_value_limit);
        dVar6 = log(base_value_limit);
        uVar4 = (uint)(dVar5 / dVar6 + 1.0);
      }
      local_24 = 0;
      std::vector<int,_std::allocator<int>_>::_M_fill_assign
                (&value_distribution->count_,(long)(int)(uVar4 + 1),&local_24);
      local_20 = 0.0;
      std::vector<double,_std::allocator<double>_>::_M_fill_assign
                (&value_distribution->limit_,(long)(int)uVar4,&local_20);
      pdVar1 = (value_distribution->limit_).super__Vector_base<double,_std::allocator<double>_>.
               _M_impl.super__Vector_impl_data._M_start;
      *pdVar1 = min_value_limit;
      if (1 < (int)uVar4) {
        dVar5 = *pdVar1;
        uVar3 = 1;
        do {
          dVar5 = dVar5 * base_value_limit;
          pdVar1[uVar3] = dVar5;
          uVar3 = uVar3 + 1;
        } while (uVar4 != uVar3);
      }
      value_distribution->num_count_ = uVar4;
      value_distribution->num_zero_ = 0;
      value_distribution->num_one_ = 0;
      value_distribution->min_value_ = INFINITY;
      value_distribution->max_value_ = 0.0;
      value_distribution->sum_count_ = 0;
      bVar2 = true;
    }
  }
  return bVar2;
}

Assistant:

bool initialiseValueDistribution(const std::string distribution_name,
                                 const std::string value_name,
                                 const double min_value_limit,
                                 const double max_value_limit,
                                 const double base_value_limit,
                                 HighsValueDistribution& value_distribution) {
  assert(min_value_limit > 0);
  assert(max_value_limit > 0);
  assert(base_value_limit > 1);
  value_distribution.distribution_name_ = distribution_name;
  value_distribution.value_name_ = value_name;
  if (min_value_limit <= 0) return false;
  if (max_value_limit < min_value_limit) return false;
  HighsInt num_count;
  if (min_value_limit == max_value_limit) {
    // For counting values below and above a value
    num_count = 1;
  } else {
    if (base_value_limit <= 0) return false;
    const double log_ratio = log(max_value_limit / min_value_limit);
    const double log_base_value_limit = log(base_value_limit);
    //    printf("initialiseValueDistribution: log_ratio = %g;
    //    log_base_value_limit = %g; log_ratio/log_base_value_limit = %g\n",
    //	   log_ratio, log_base_value_limit, log_ratio/log_base_value_limit);
    num_count = log_ratio / log_base_value_limit + 1;
  }
  //  printf("initialiseValueDistribution: num_count = %" HIGHSINT_FORMAT "\n",
  //  num_count);
  value_distribution.count_.assign(num_count + 1, 0);
  value_distribution.limit_.assign(num_count, 0);
  value_distribution.limit_[0] = min_value_limit;
  //  printf("Interval  0 is [%10.4g, %10.4g)\n", 0.0,
  //  value_distribution.limit_[0]);
  for (HighsInt i = 1; i < num_count; i++) {
    value_distribution.limit_[i] =
        base_value_limit * value_distribution.limit_[i - 1];
    //    printf("Interval %2" HIGHSINT_FORMAT " is [%10.4g, %10.4g)\n", i,
    //    value_distribution.limit_[i-1], value_distribution.limit_[i]);
  }
  //  printf("Interval %2" HIGHSINT_FORMAT " is [%10.4g, inf)\n", num_count,
  //  value_distribution.limit_[num_count-1]);
  value_distribution.num_count_ = num_count;
  value_distribution.num_zero_ = 0;
  value_distribution.num_one_ = 0;
  value_distribution.min_value_ = kHighsInf;
  value_distribution.max_value_ = 0;
  value_distribution.sum_count_ = 0;
  return true;
}